

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

TestCase *
Catch::makeTestCase(TestCase *__return_storage_ptr__,ITestInvoker *_testCase,string *_className,
                   NameAndTags *nameAndTags,SourceLineInfo *_lineInfo)

{
  char cVar1;
  char *pcVar2;
  size_type sVar3;
  pointer __position;
  SpecialProperties SVar4;
  int iVar5;
  long lVar6;
  bool bVar7;
  bool bVar8;
  size_type sVar9;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator<char> local_181;
  SourceLineInfo *local_180;
  string tag;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tags;
  string local_118;
  string desc;
  TestCaseInfo info;
  
  tags.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  desc._M_dataplus._M_p = (pointer)&desc.field_2;
  desc._M_string_length = 0;
  tags.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  tags.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  sVar9 = 0;
  desc.field_2._M_local_buf[0] = '\0';
  tag._M_dataplus._M_p = (pointer)&tag.field_2;
  tag._M_string_length = 0;
  tag.field_2._M_local_buf[0] = '\0';
  pcVar2 = (nameAndTags->tags).m_start;
  sVar3 = (nameAndTags->tags).m_size;
  bVar7 = false;
  bVar8 = false;
  local_180 = _lineInfo;
  do {
    __position = tags.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
    if (sVar3 == sVar9) {
      if (bVar8) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&info,".",(allocator<char> *)&local_118);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&info.className,"!hide",&local_181);
        __l._M_len = 2;
        __l._M_array = &info.name;
        clara::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::insert(&tags,(const_iterator)__position,__l);
        lVar6 = 0x20;
        do {
          std::__cxx11::string::~string((string *)((long)&info.name._M_dataplus._M_p + lVar6));
          lVar6 = lVar6 + -0x20;
        } while (lVar6 != -0x20);
      }
      StringRef::operator_cast_to_string(&local_118,&nameAndTags->name);
      TestCaseInfo::TestCaseInfo(&info,&local_118,_className,&desc,&tags,local_180);
      std::__cxx11::string::~string((string *)&local_118);
      TestCase::TestCase(__return_storage_ptr__,_testCase,&info);
      TestCaseInfo::~TestCaseInfo(&info);
      std::__cxx11::string::~string((string *)&tag);
      std::__cxx11::string::~string((string *)&desc);
      clara::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&tags);
      return __return_storage_ptr__;
    }
    cVar1 = pcVar2[sVar9];
    if (bVar7) {
      if (cVar1 == ']') {
        SVar4 = anon_unknown_1::parseSpecialTag(&tag);
        bVar7 = true;
        if (((((SVar4 & IsHidden) == None) && (bVar7 = bVar8, SVar4 == None)) &&
            (SVar4 = anon_unknown_1::parseSpecialTag(&tag),
            tag._M_string_length != 0 && SVar4 == None)) &&
           (iVar5 = isalnum((uint)(byte)*tag._M_dataplus._M_p), iVar5 == 0)) {
          ReusableStringStream::ReusableStringStream((ReusableStringStream *)&local_118);
          std::operator<<((ostream *)local_118.field_2._M_allocated_capacity,"Tag name: [");
          std::operator<<((ostream *)local_118.field_2._M_allocated_capacity,(string *)&tag);
          std::operator<<((ostream *)local_118.field_2._M_allocated_capacity,"] is not allowed.\n");
          std::operator<<((ostream *)local_118.field_2._M_allocated_capacity,
                          "Tag names starting with non alphanumeric characters are reserved\n");
          operator<<((ostream *)local_118.field_2._M_allocated_capacity,local_180);
          std::__cxx11::stringbuf::str();
          throw_domain_error(&info.name);
        }
        bVar8 = bVar7;
        if (((tag._M_string_length != 0) && (tag._M_string_length != 1)) &&
           (*tag._M_dataplus._M_p == '.')) {
          std::__cxx11::string::erase((ulong)&tag,0);
        }
        clara::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&tags,&tag);
        tag._M_string_length = 0;
        *tag._M_dataplus._M_p = '\0';
LAB_001272a8:
        bVar7 = false;
      }
      else {
        bVar7 = true;
        std::__cxx11::string::push_back((char)&tag);
      }
    }
    else {
      bVar7 = true;
      if (cVar1 != '[') {
        std::__cxx11::string::push_back((char)&desc);
        goto LAB_001272a8;
      }
    }
    sVar9 = sVar9 + 1;
  } while( true );
}

Assistant:

TestCase makeTestCase(  ITestInvoker* _testCase,
                            std::string const& _className,
                            NameAndTags const& nameAndTags,
                            SourceLineInfo const& _lineInfo )
    {
        bool isHidden = false;

        // Parse out tags
        std::vector<std::string> tags;
        std::string desc, tag;
        bool inTag = false;
        for (char c : nameAndTags.tags) {
            if( !inTag ) {
                if( c == '[' )
                    inTag = true;
                else
                    desc += c;
            }
            else {
                if( c == ']' ) {
                    TestCaseInfo::SpecialProperties prop = parseSpecialTag( tag );
                    if( ( prop & TestCaseInfo::IsHidden ) != 0 )
                        isHidden = true;
                    else if( prop == TestCaseInfo::None )
                        enforceNotReservedTag( tag, _lineInfo );

                    // Merged hide tags like `[.approvals]` should be added as
                    // `[.][approvals]`. The `[.]` is added at later point, so
                    // we only strip the prefix
                    if (startsWith(tag, '.') && tag.size() > 1) {
                        tag.erase(0, 1);
                    }
                    tags.push_back( tag );
                    tag.clear();
                    inTag = false;
                }
                else
                    tag += c;
            }
        }
        if( isHidden ) {
            // Add all "hidden" tags to make them behave identically
            tags.insert( tags.end(), { ".", "!hide" } );
        }

        TestCaseInfo info( static_cast<std::string>(nameAndTags.name), _className, desc, tags, _lineInfo );
        return TestCase( _testCase, std::move(info) );
    }